

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O2

FT_Error pfr_face_get_kerning(FT_Face pfrface,FT_UInt glyph1,FT_UInt glyph2,FT_Vector *kerning)

{
  byte bVar1;
  byte bVar2;
  FT_Stream stream;
  long lVar3;
  byte *pbVar4;
  FT_Error FVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  FT_Pos *pFVar14;
  
  uVar9 = glyph1 - 1;
  if (glyph1 == 0) {
    uVar9 = 0;
  }
  uVar8 = glyph2 - 1;
  if (glyph2 == 0) {
    uVar8 = 0;
  }
  kerning->x = 0;
  kerning->y = 0;
  uVar13 = *(uint *)&pfrface[2].generic.data;
  if (uVar13 < uVar8 || uVar13 < uVar9) {
    return 0;
  }
  stream = pfrface->stream;
  lVar3 = pfrface[2].bbox.xMin;
  uVar9 = *(int *)(lVar3 + (ulong)uVar9 * 0x10) << 0x10 |
          (uint)*(ushort *)(lVar3 + (ulong)uVar8 * 0x10);
  pFVar14 = &pfrface[2].bbox.xMax;
  do {
    pFVar14 = (FT_Pos *)*pFVar14;
    if (pFVar14 == (FT_Pos *)0x0) {
      return 0;
    }
  } while ((uVar9 < *(uint *)(pFVar14 + 3)) || (*(uint *)((long)pFVar14 + 0x1c) < uVar9));
  FVar5 = FT_Stream_Seek(stream,pFVar14[2]);
  if (FVar5 != 0) {
    return FVar5;
  }
  FVar5 = FT_Stream_EnterFrame
                    (stream,(ulong)((uint)(byte)pFVar14[1] * *(int *)((long)pFVar14 + 0xc)));
  if (FVar5 != 0) {
    return FVar5;
  }
  bVar1 = (byte)pFVar14[1];
  uVar8 = *(uint *)((long)pFVar14 + 0xc);
  iVar10 = 0x1f;
  if (bVar1 != 0) {
    for (; bVar1 >> iVar10 == 0; iVar10 = iVar10 + -1) {
    }
  }
  uVar6 = (ulong)(uVar8 << ((byte)iVar10 & 0x1f));
  pbVar4 = stream->cursor;
  bVar2 = *(byte *)((long)pFVar14 + 9);
  iVar10 = (-1 << ((byte)iVar10 & 0x1f)) + (uint)bVar1;
  if (iVar10 == 0) {
LAB_00202f5c:
    while (pbVar7 = pbVar4, uVar8 < (uint)uVar6) {
      uVar6 = (ulong)((uint)uVar6 >> 1);
      pbVar4 = pbVar7 + uVar6;
      if ((bVar2 & 1) == 0) {
        pbVar12 = pbVar4 + 2;
        uVar13 = (uint)pbVar7[uVar6] << 0x10 | (uint)pbVar7[uVar6 + 1];
      }
      else {
        pbVar12 = pbVar4 + 4;
        uVar13 = (uint)pbVar4[3] |
                 (uint)pbVar4[2] << 8 |
                 (uint)pbVar7[uVar6 + 1] << 0x10 | (uint)pbVar7[uVar6] << 0x18;
      }
      if (uVar13 == uVar9) goto LAB_00202f9d;
      if (uVar9 <= uVar13) {
        pbVar4 = pbVar7;
      }
    }
    if ((bVar2 & 1) == 0) {
      pbVar12 = pbVar7 + 2;
      uVar8 = (uint)*pbVar7 << 0x10 | (uint)pbVar7[1];
    }
    else {
      pbVar12 = pbVar7 + 4;
      uVar8 = (uint)pbVar7[3] |
              (uint)pbVar7[2] << 8 | (uint)pbVar7[1] << 0x10 | (uint)*pbVar7 << 0x18;
    }
    if (uVar8 != uVar9) goto LAB_00202fc5;
  }
  else {
    uVar11 = (ulong)(iVar10 * uVar8);
    if ((bVar2 & 1) == 0) {
      lVar3 = uVar11 + 2;
      uVar13 = (uint)pbVar4[uVar11] << 0x10 | (uint)pbVar4[uVar11 + 1];
    }
    else {
      lVar3 = uVar11 + 4;
      uVar13 = (uint)pbVar4[uVar11 + 3] |
               (uint)pbVar4[uVar11 + 2] << 8 |
               (uint)pbVar4[uVar11 + 1] << 0x10 | (uint)pbVar4[uVar11] << 0x18;
    }
    pbVar12 = pbVar4 + lVar3;
    if (uVar13 != uVar9) {
      if (uVar13 < uVar9) {
        pbVar4 = pbVar12 + (2 - (ulong)((bVar2 & 2) == 0));
      }
      goto LAB_00202f5c;
    }
  }
LAB_00202f9d:
  uVar6 = (ulong)*pbVar12;
  if ((bVar2 & 2) != 0) {
    uVar6 = (long)(short)((ushort)*pbVar12 << 8) | (ulong)pbVar12[1];
  }
  kerning->x = (long)*(short *)((long)pFVar14 + 10) + uVar6;
LAB_00202fc5:
  FT_Stream_ExitFrame(stream);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_get_kerning( FT_Face     pfrface,        /* PFR_Face */
                        FT_UInt     glyph1,
                        FT_UInt     glyph2,
                        FT_Vector*  kerning )
  {
    PFR_Face     face     = (PFR_Face)pfrface;
    FT_Error     error    = FT_Err_Ok;
    PFR_PhyFont  phy_font = &face->phy_font;
    FT_UInt32    code1, code2, pair;


    kerning->x = 0;
    kerning->y = 0;

    if ( glyph1 > 0 )
      glyph1--;

    if ( glyph2 > 0 )
      glyph2--;

    /* convert glyph indices to character codes */
    if ( glyph1 > phy_font->num_chars ||
         glyph2 > phy_font->num_chars )
      goto Exit;

    code1 = phy_font->chars[glyph1].char_code;
    code2 = phy_font->chars[glyph2].char_code;
    pair  = PFR_KERN_INDEX( code1, code2 );

    /* now search the list of kerning items */
    {
      PFR_KernItem  item   = phy_font->kern_items;
      FT_Stream     stream = pfrface->stream;


      for ( ; item; item = item->next )
      {
        if ( pair >= item->pair1 && pair <= item->pair2 )
          goto FoundPair;
      }
      goto Exit;

    FoundPair: /* we found an item, now parse it and find the value if any */
      if ( FT_STREAM_SEEK( item->offset )                       ||
           FT_FRAME_ENTER( item->pair_count * item->pair_size ) )
        goto Exit;

      {
        FT_UInt    count       = item->pair_count;
        FT_UInt    size        = item->pair_size;
        FT_UInt    power       = 1 << FT_MSB( count );
        FT_UInt    probe       = power * size;
        FT_UInt    extra       = count - power;
        FT_Byte*   base        = stream->cursor;
        FT_Bool    twobytes    = FT_BOOL( item->flags & PFR_KERN_2BYTE_CHAR );
        FT_Bool    twobyte_adj = FT_BOOL( item->flags & PFR_KERN_2BYTE_ADJ  );
        FT_Byte*   p;
        FT_UInt32  cpair;


        if ( extra > 0 )
        {
          p = base + extra * size;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
          {
            if ( twobyte_adj )
              p += 2;
            else
              p++;
            base = p;
          }
        }

        while ( probe > size )
        {
          probe >>= 1;
          p       = base + probe;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
            base += probe;
        }

        p = base;

        if ( twobytes )
          cpair = FT_NEXT_ULONG( p );
        else
          cpair = PFR_NEXT_KPAIR( p );

        if ( cpair == pair )
        {
          FT_Int  value;


        Found:
          if ( twobyte_adj )
            value = FT_PEEK_SHORT( p );
          else
            value = p[0];

          kerning->x = item->base_adj + value;
        }
      }

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }